

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O3

void __thiscall
MuxerManager::asyncWriteBuffer
          (MuxerManager *this,AbstractMuxer *muxer,uint8_t *buff,int len,
          AbstractOutputStream *dstFile)

{
  pointer *ppWVar1;
  iterator __position;
  WriterData local_20;
  
  local_20.m_command = wdWrite;
  local_20.m_buffer = buff;
  local_20.m_bufferLen = len;
  local_20.m_mainFile = dstFile;
  if ((this->m_interleave == true) && (this->m_mainMuxer == muxer)) {
    __position._M_current =
         (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<WriterData,std::allocator<WriterData>>::_M_realloc_insert<WriterData_const&>
                ((vector<WriterData,std::allocator<WriterData>> *)&this->m_delayedData,__position,
                 &local_20);
    }
    else {
      (__position._M_current)->m_mainFile = dstFile;
      *(ulong *)&(__position._M_current)->m_command = CONCAT44(local_20._28_4_,1);
      (__position._M_current)->m_buffer = buff;
      *(ulong *)&(__position._M_current)->m_bufferLen = CONCAT44(local_20._12_4_,len);
      ppWVar1 = &(this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + 1;
    }
  }
  else {
    asyncWriteBlock(this,&local_20);
  }
  return;
}

Assistant:

void MuxerManager::asyncWriteBuffer(const AbstractMuxer* muxer, uint8_t* buff, const int len,
                                    AbstractOutputStream* dstFile)
{
    WriterData data;
    data.m_buffer = buff;
    data.m_bufferLen = len;
    data.m_mainFile = dstFile;
    data.m_command = WriterData::Commands::wdWrite;

    if (m_interleave && muxer == m_mainMuxer)
    {
        // do interleave of SSIF blocks. Place sub channel blocks first, delay main muxer blocks
        m_delayedData.push_back(data);
        return;
    }

    asyncWriteBlock(data);
}